

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::ReplicatedAssignmentPatternSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ReplicatedAssignmentPatternSyntax *this,
          size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  SyntaxNode *node;
  SyntaxNode *local_80;
  size_t index_local;
  ReplicatedAssignmentPatternSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->openBrace).kind;
    token._2_1_ = (this->openBrace).field_0x2;
    token.numFlags.raw = (this->openBrace).numFlags.raw;
    token.rawLen = (this->openBrace).rawLen;
    token.info = (this->openBrace).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->countExpr)->super_SyntaxNode;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 2:
    token_00.kind = (this->innerOpenBrace).kind;
    token_00._2_1_ = (this->innerOpenBrace).field_0x2;
    token_00.numFlags.raw = (this->innerOpenBrace).numFlags.raw;
    token_00.rawLen = (this->innerOpenBrace).rawLen;
    token_00.info = (this->innerOpenBrace).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 3:
    local_80 = (SyntaxNode *)0x0;
    if (this != (ReplicatedAssignmentPatternSyntax *)0xffffffffffffffc8) {
      local_80 = &(this->items).super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  case 4:
    token_01.kind = (this->innerCloseBrace).kind;
    token_01._2_1_ = (this->innerCloseBrace).field_0x2;
    token_01.numFlags.raw = (this->innerCloseBrace).numFlags.raw;
    token_01.rawLen = (this->innerCloseBrace).rawLen;
    token_01.info = (this->innerCloseBrace).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 5:
    token_02.kind = (this->closeBrace).kind;
    token_02._2_1_ = (this->closeBrace).field_0x2;
    token_02.numFlags.raw = (this->closeBrace).numFlags.raw;
    token_02.rawLen = (this->closeBrace).rawLen;
    token_02.info = (this->closeBrace).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ReplicatedAssignmentPatternSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openBrace;
        case 1: return countExpr.get();
        case 2: return innerOpenBrace;
        case 3: return &items;
        case 4: return innerCloseBrace;
        case 5: return closeBrace;
        default: return nullptr;
    }
}